

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O1

UINT8 __thiscall VGMPlayer::Stop(VGMPlayer *this)

{
  long lVar1;
  PLAYER_EVENT_CB p_Var2;
  pointer pDVar3;
  pointer pDVar4;
  pointer pCVar5;
  long lVar6;
  ulong uVar7;
  
  this->_playState = this->_playState & 0xfe;
  pDVar3 = (this->_dacStreams).
           super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pDVar4 = (this->_dacStreams).
           super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pDVar4 != pDVar3) {
    lVar6 = 0x10;
    uVar7 = 0;
    do {
      (**(code **)(*(long *)((long)&(pDVar3->defInf).dataPtr + lVar6) + 0x20))
                (*(undefined8 *)((long)pDVar3 + lVar6 + -0x10));
      uVar7 = uVar7 + 1;
      pDVar3 = (this->_dacStreams).
               super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pDVar4 = (this->_dacStreams).
               super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      lVar6 = lVar6 + 0x38;
    } while (uVar7 < (ulong)(((long)pDVar4 - (long)pDVar3 >> 3) * 0x6db6db6db6db6db7));
  }
  if (pDVar4 != pDVar3) {
    (this->_dacStreams).
    super__Vector_base<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>._M_impl.
    super__Vector_impl_data._M_finish = pDVar3;
  }
  lVar6 = 0x57b8;
  do {
    lVar1 = *(long *)((long)this + lVar6 + -0x20);
    if (*(long *)((long)this + lVar6 + -0x18) != lVar1) {
      *(long *)((long)this + lVar6 + -0x18) = lVar1;
    }
    lVar1 = *(long *)((long)this + lVar6 + -8);
    if (*(long *)((long)&(this->super_PlayerBase)._vptr_PlayerBase + lVar6) != lVar1) {
      *(long *)((long)&(this->super_PlayerBase)._vptr_PlayerBase + lVar6) = lVar1;
    }
    lVar1 = *(long *)((long)this + lVar6 + -0x38);
    if (*(long *)((long)this + lVar6 + -0x30) != lVar1) {
      *(long *)((long)this + lVar6 + -0x30) = lVar1;
    }
    lVar6 = lVar6 + 0x48;
  } while (lVar6 != 0x69b8);
  free((this->_pcmComprTbl).values.d8);
  (this->_pcmComprTbl).values.d8 = (UINT8 *)0x0;
  pCVar5 = (this->_devices).
           super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devices).
      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar5) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      FreeDeviceTree((VGM_BASEDEV *)((long)(pCVar5->base).resmpl.smplBufs + lVar6 + -0x70),'\0');
      uVar7 = uVar7 + 1;
      pCVar5 = (this->_devices).
               super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = lVar6 + 0xf0;
    } while (uVar7 < (ulong)(((long)(this->_devices).
                                    super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5 >> 4)
                            * -0x1111111111111111));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->_devNames,
                    (this->_devNames).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pCVar5 = (this->_devices).
           super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->_devices).
      super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar5) {
    (this->_devices).
    super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar5;
  }
  std::vector<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>::_M_erase_at_end
            (&this->_devCfgs,
             (this->_devCfgs).
             super__Vector_base<VGMPlayer::SONG_DEV_CFG,_std::allocator<VGMPlayer::SONG_DEV_CFG>_>.
             _M_impl.super__Vector_impl_data._M_start);
  p_Var2 = (this->super_PlayerBase)._eventCbFunc;
  if (p_Var2 != (PLAYER_EVENT_CB)0x0) {
    (*p_Var2)(&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x02',(void *)0x0);
  }
  return '\0';
}

Assistant:

UINT8 VGMPlayer::Stop(void)
{
	size_t curDev;
	size_t curBank;
	
	_playState &= ~PLAYSTATE_PLAY;
	
	for (curDev = 0; curDev < _dacStreams.size(); curDev ++)
	{
		DEV_INFO* devInf = &_dacStreams[curDev].defInf;
		devInf->devDef->Stop(devInf->dataPtr);
	}
	_dacStreams.clear();
	
	for (curBank = 0x00; curBank < _PCM_BANK_COUNT; curBank ++)
	{
		PCM_BANK* pcmBnk = &_pcmBank[curBank];
		pcmBnk->bankOfs.clear();
		pcmBnk->bankSize.clear();
		pcmBnk->data.clear();
	}
	free(_pcmComprTbl.values.d8);	_pcmComprTbl.values.d8 = NULL;
	
	for (curDev = 0; curDev < _devices.size(); curDev ++)
		FreeDeviceTree(&_devices[curDev].base, 0);
	_devNames.clear();
	_devices.clear();
	_devCfgs.clear();
	if (_eventCbFunc != NULL)
		_eventCbFunc(this, _eventCbParam, PLREVT_STOP, NULL);
	
	return 0x00;
}